

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O2

void __thiscall
PartsBupOutputter::setBase(PartsBupOutputter *this,path *basePath,Image *img,string *name)

{
  path *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  allocator<char> local_c1;
  path local_c0;
  path local_98;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_c0,name,auto_format);
  std::filesystem::__cxx11::operator/(&local_98,basePath,&local_c0);
  this_00 = &this->partsPath;
  std::filesystem::__cxx11::path::operator=(this_00,&local_98);
  std::filesystem::__cxx11::path::~path(&local_98);
  std::filesystem::__cxx11::path::~path(&local_c0);
  std::filesystem::create_directory(this_00);
  std::operator+(&local_50,name,".png");
  std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
            (&local_c0,(__cxx11 *)&local_50,__source);
  std::filesystem::__cxx11::operator/(&local_98,this_00,&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_c1);
  Image::writePNG(img,&local_98,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::filesystem::__cxx11::path::~path(&local_98);
  std::filesystem::__cxx11::path::~path(&local_c0);
  std::__cxx11::string::~string((string *)&local_50);
  std::filesystem::__cxx11::path::operator=(&this->basePath,basePath);
  std::__cxx11::string::operator=((string *)&this->baseName,(string *)name);
  Image::operator=(&this->base,img);
  return;
}

Assistant:

void setBase(fs::path basePath, Image img, std::string name) override {
		partsPath = basePath/name;
		fs::create_directory(partsPath);
		img.writePNG(partsPath/fs::u8path(name + ".png"));
		this->basePath = std::move(basePath);
		baseName = std::move(name);
		base = std::move(img);
	}